

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ObjPrepareCi(Nf_Man_t *p,int iObj,int Time)

{
  Nf_Mat_t *pNVar1;
  Nf_Mat_t *pNVar2;
  Nf_Mat_t *pNVar3;
  Nf_Mat_t *pNVar4;
  Nf_Mat_t *pA;
  Nf_Mat_t *pD;
  Nf_Mat_t *pA0;
  Nf_Mat_t *pD0;
  int Time_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  pNVar1 = Nf_ObjMatchD(p,iObj,0);
  pNVar2 = Nf_ObjMatchA(p,iObj,0);
  pNVar3 = Nf_ObjMatchD(p,iObj,1);
  pNVar4 = Nf_ObjMatchA(p,iObj,1);
  pNVar4->D = Time;
  pNVar3->D = Time;
  pNVar2->D = Time;
  pNVar1->D = Time;
  *(uint *)pNVar3 = *(uint *)pNVar3 & 0xbfffffff | 0x40000000;
  pNVar3->D = p->InvDelayI + pNVar3->D;
  pNVar3->F = p->InvAreaF;
  *(uint *)pNVar4 = *(uint *)pNVar4 & 0xbfffffff | 0x40000000;
  pNVar4->D = p->InvDelayI + pNVar4->D;
  pNVar4->F = p->InvAreaF;
  pNVar1 = Nf_ObjMatchD(p,iObj,0);
  *(uint *)pNVar1 = *(uint *)pNVar1 & 0x7fffffff | 0x80000000;
  pNVar1 = Nf_ObjMatchD(p,iObj,1);
  *(uint *)pNVar1 = *(uint *)pNVar1 & 0x7fffffff | 0x80000000;
  return;
}

Assistant:

static inline void Nf_ObjPrepareCi( Nf_Man_t * p, int iObj, int Time )
{
    Nf_Mat_t * pD0 = Nf_ObjMatchD( p, iObj, 0 );
    Nf_Mat_t * pA0 = Nf_ObjMatchA( p, iObj, 0 );
    Nf_Mat_t * pD = Nf_ObjMatchD( p, iObj, 1 );
    Nf_Mat_t * pA = Nf_ObjMatchA( p, iObj, 1 );
    pD0->D = pA0->D = pD->D = pA->D = Time;
    pD->fCompl = 1;
    pD->D += p->InvDelayI;
    pD->F = p->InvAreaF;
    pA->fCompl = 1;
    pA->D += p->InvDelayI;
    pA->F = p->InvAreaF;
    Nf_ObjMatchD( p, iObj, 0 )->fBest = 1;
    Nf_ObjMatchD( p, iObj, 1 )->fBest = 1;
}